

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

void __thiscall Highs::Highs(Highs *this)

{
  this->_vptr_Highs = (_func_int **)&PTR__Highs_004487b8;
  (this->solution_).value_valid = false;
  (this->solution_).dual_valid = false;
  (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->solution_).col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->solution_).col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solution_).col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->solution_).row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->solution_).row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solution_).row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->solution_).row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->solution_).row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solution_).row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basis_).valid = false;
  (this->basis_).alien = true;
  (this->basis_).useful = false;
  (this->basis_).was_alien = true;
  (this->basis_).debug_id = -1;
  (this->basis_).debug_update_count = -1;
  (this->basis_).debug_origin_name._M_dataplus._M_p =
       (pointer)&(this->basis_).debug_origin_name.field_2;
  *(undefined4 *)&(this->basis_).debug_origin_name.field_2 = 0x656e6f4e;
  (this->basis_).debug_origin_name._M_string_length = 4;
  (this->basis_).debug_origin_name.field_2._M_local_buf[4] = '\0';
  (this->basis_).row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basis_).row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basis_).col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basis_).row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basis_).col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basis_).col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->icrash_info_).x_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->icrash_info_).x_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->icrash_info_).details.
  super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->icrash_info_).x_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->icrash_info_).details.
  super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->icrash_info_).details.
  super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  HighsLp::HighsLp(&(this->model_).lp_);
  HighsHessian::HighsHessian(&(this->model_).hessian_);
  (this->multi_linear_objective_).
  super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->multi_linear_objective_).
  super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->multi_linear_objective_).
  super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HighsLp::HighsLp(&(this->presolved_model_).lp_);
  HighsHessian::HighsHessian(&(this->presolved_model_).hessian_);
  HighsTimer::HighsTimer(&this->timer_);
  (this->callback_).active.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->callback_).active.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  (this->callback_).active.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  *(undefined8 *)&(this->callback_).user_callback.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback_).user_callback.super__Function_base._M_functor + 8) = 0;
  (this->callback_).user_callback.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback_).user_callback._M_invoker = (_Invoker_type)0x0;
  (this->callback_).c_callback = (HighsCCallbackType)0x0;
  (this->callback_).user_callback_data = (void *)0x0;
  *(undefined8 *)((long)&(this->callback_).user_callback_data + 4) = 0;
  *(undefined8 *)
   ((long)&(this->callback_).active.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base + 4) = 0;
  HighsOptions::HighsOptions(&this->options_);
  HighsInfo::HighsInfo(&this->info_);
  (this->ranging_).valid = false;
  memset(&(this->ranging_).col_cost_up,0,0x241);
  memset(&(this->iis_).strategy_,0,0x94);
  this->model_presolve_status_ = kNotPresolved;
  this->model_status_ = kMin;
  (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HighsSparseMatrix::HighsSparseMatrix(&this->standard_form_matrix_);
  HEkk::HEkk(&this->ekk_instance_);
  *(undefined8 *)
   ((long)&(this->presolve_log_).rule.
           super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->presolve_log_).rule.
           super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->presolve_log_).rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->presolve_log_).rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->called_return_from_run = true;
  this->debug_run_call_num_ = 0;
  this->written_log_header_ = false;
  (this->presolve_).super_HighsComponent.info_ = false;
  (this->presolve_).super_HighsComponent.data_ = false;
  (this->presolve_).super_HighsComponent.options_.is_valid = false;
  (this->presolve_).super_HighsComponent._vptr_HighsComponent = (_func_int **)&PTR_clear_00449170;
  (this->presolve_).info_.super_HighsComponentInfo.is_valid = false;
  (this->presolve_).info_._vptr_PresolveComponentInfo =
       (_func_int **)&PTR__PresolveComponentInfo_00448d70;
  (this->presolve_).info_.n_rows_removed = 0;
  (this->presolve_).info_.n_cols_removed = 0;
  *(undefined8 *)&(this->presolve_).info_.n_nnz_removed = 0;
  (this->presolve_).info_.presolve_time = 0.0;
  (this->presolve_).info_.postsolve_time = 0.0;
  (this->presolve_).data_.super_HighsComponentData.is_valid = false;
  (this->presolve_).data_._vptr_PresolveComponentData =
       (_func_int **)&PTR__PresolveComponentData_004487e8;
  HighsLp::HighsLp(&(this->presolve_).data_.reduced_lp_);
  *(pointer *)
   ((long)&(this->presolve_).data_.postSolveStack.reductionValues.data.
           super__Vector_base<char,_std::allocator<char>_>._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.postSolveStack.reductionValues.data.
           super__Vector_base<char,_std::allocator<char>_>._M_impl + 0x10) = (pointer)0x0;
  (this->presolve_).data_.postSolveStack.debug_prev_row_upper = 0.0;
  (this->presolve_).data_.postSolveStack.reductionValues.data.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->presolve_).data_.postSolveStack.debug_prev_col_upper = 0.0;
  (this->presolve_).data_.postSolveStack.debug_prev_row_lower = 0.0;
  (this->presolve_).data_.postSolveStack.debug_prev_numreductions = 0;
  (this->presolve_).data_.postSolveStack.debug_prev_col_lower = 0.0;
  memset(&(this->presolve_).data_.postSolveStack.reductions,0,0x90);
  (this->presolve_).data_.postSolveStack.origNumCol = -1;
  (this->presolve_).data_.postSolveStack.origNumRow = -1;
  (this->presolve_).data_.recovered_solution_.value_valid = false;
  (this->presolve_).data_.recovered_solution_.dual_valid = false;
  (this->presolve_).data_.recovered_solution_.col_value.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.recovered_solution_.col_value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.recovered_solution_.col_value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x10) = (pointer)0x0;
  (this->presolve_).data_.recovered_solution_.col_dual.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.recovered_solution_.col_dual.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.recovered_solution_.col_dual.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x10) = (pointer)0x0;
  (this->presolve_).data_.recovered_solution_.row_value.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.recovered_solution_.row_value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.recovered_solution_.row_value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x10) = (pointer)0x0;
  (this->presolve_).data_.recovered_solution_.row_dual.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.recovered_solution_.row_dual.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.recovered_solution_.row_dual.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x10) = (pointer)0x0;
  (this->presolve_).data_.recovered_basis_.valid = false;
  (this->presolve_).data_.recovered_basis_.alien = true;
  (this->presolve_).data_.recovered_basis_.useful = false;
  (this->presolve_).data_.recovered_basis_.was_alien = true;
  (this->presolve_).data_.recovered_basis_.debug_id = -1;
  (this->presolve_).data_.recovered_basis_.debug_update_count = -1;
  (this->presolve_).data_.recovered_basis_.debug_origin_name._M_dataplus._M_p =
       (pointer)&(this->presolve_).data_.recovered_basis_.debug_origin_name.field_2;
  *(undefined4 *)&(this->presolve_).data_.recovered_basis_.debug_origin_name.field_2 = 0x656e6f4e;
  (this->presolve_).data_.recovered_basis_.debug_origin_name._M_string_length = 4;
  (this->presolve_).data_.recovered_basis_.debug_origin_name.field_2._M_local_buf[4] = '\0';
  (this->presolve_).data_.presolve_log_.rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.presolve_log_.rule.
           super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.recovered_basis_.row_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.recovered_basis_.row_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.recovered_basis_.col_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->presolve_).data_.recovered_basis_.row_status.
  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->presolve_).data_.recovered_basis_.col_status.
  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.recovered_basis_.col_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->presolve_).data_.presolve_log_.rule.
           super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->presolve_).presolve_status_ = kNotPresolved;
  (this->presolve_).postsolve_status_ = kNotPresolved;
  return;
}

Assistant:

Highs::Highs() {}